

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::Program::~Program(Program *this)

{
  Shader *pSVar1;
  long lVar2;
  StructType *this_00;
  _Rb_tree_node_base *p_Var3;
  pointer ppSVar4;
  pointer ppSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  structTypes;
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)(this->m_shaders).
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_shaders).
                             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar11 = 0;
    do {
      pSVar1 = (this->m_shaders).
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11];
      lVar8 = *(long *)&(pSVar1->m_defaultBlock).variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&(pSVar1->m_defaultBlock).variables.
                                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                   + 8) - lVar8) >> 5) * -0x55555555) {
        lVar7 = 0x20;
        lVar9 = 0;
        do {
          collectStructPtrs((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                             *)&local_60,(VarType *)(lVar8 + lVar7));
          lVar9 = lVar9 + 1;
          pSVar1 = (this->m_shaders).
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11];
          lVar8 = *(long *)&(pSVar1->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl;
          lVar7 = lVar7 + 0x60;
        } while (lVar9 < (int)((ulong)((long)*(pointer *)
                                              ((long)&(pSVar1->m_defaultBlock).variables.
                                                                                                            
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              + 8) - lVar8) >> 5) * -0x55555555);
      }
      pSVar1 = (this->m_shaders).
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11];
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                   + 8) -
                           *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                     super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                     ._M_impl.super__Vector_impl_data) >> 4) * 0x38e38e39) {
        lVar8 = 0;
        do {
          lVar7 = *(long *)&((this->m_shaders).
                             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar11]->m_defaultBlock).
                            interfaceBlocks.
                            super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                            ._M_impl.super__Vector_impl_data;
          lVar6 = lVar8 * 0x90;
          lVar9 = *(long *)(lVar7 + 0x60 + lVar6);
          if (0 < (int)((ulong)(*(long *)(lVar7 + 0x68 + lVar6) - lVar9) >> 5) * -0x55555555) {
            lVar7 = 0x20;
            lVar10 = 0;
            do {
              collectStructPtrs((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                                 *)&local_60,(VarType *)(lVar9 + lVar7));
              lVar10 = lVar10 + 1;
              lVar2 = *(long *)&((this->m_shaders).
                                 super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar11]->m_defaultBlock).
                                interfaceBlocks.
                                super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                ._M_impl.super__Vector_impl_data;
              lVar9 = *(long *)(lVar2 + 0x60 + lVar6);
              lVar7 = lVar7 + 0x60;
            } while (lVar10 < (int)((ulong)(*(long *)(lVar2 + 0x68 + lVar6) - lVar9) >> 5) *
                              -0x55555555);
          }
          lVar8 = lVar8 + 1;
          pSVar1 = (this->m_shaders).
                   super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11];
        } while (lVar8 < (int)((ulong)((long)*(pointer *)
                                              ((long)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                                                                                            
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                              + 8) -
                                      *(long *)&(pSVar1->m_defaultBlock).interfaceBlocks.
                                                super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                                ._M_impl.super__Vector_impl_data) >> 4) * 0x38e38e39
                );
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)(this->m_shaders).
                                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_shaders).
                                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    this_00 = *(StructType **)(p_Var3 + 1);
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
      operator_delete(this_00,0x38);
    }
  }
  std::
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~_Rb_tree(&local_60);
  ppSVar4 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar5 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppSVar5 - (long)ppSVar4) >> 3)) {
    lVar11 = 0;
    do {
      pSVar1 = ppSVar4[lVar11];
      if (pSVar1 != (Shader *)0x0) {
        std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::~vector
                  (&(pSVar1->m_defaultBlock).interfaceBlocks);
        std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
                  (&(pSVar1->m_defaultBlock).variables);
        operator_delete(pSVar1,0x38);
      }
      lVar11 = lVar11 + 1;
      ppSVar4 = (this->m_shaders).
                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar5 = (this->m_shaders).
                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar11 < (int)((ulong)((long)ppSVar5 - (long)ppSVar4) >> 3));
  }
  if (ppSVar5 != ppSVar4) {
    (this->m_shaders).
    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_xfbVaryings);
  ppSVar4 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->m_shaders).
                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  return;
}

Assistant:

Program::~Program (void)
{
	// delete shader struct types, need to be done by the program since shaders might share struct types
	{
		std::set<const glu::StructType*> structTypes;

		for (int shaderNdx = 0; shaderNdx < (int)m_shaders.size(); ++shaderNdx)
		{
			for (int varNdx = 0; varNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.variables.size(); ++varNdx)
				collectStructPtrs(structTypes, m_shaders[shaderNdx]->m_defaultBlock.variables[varNdx].varType);

			for (int interfaceNdx = 0; interfaceNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
				for (int varNdx = 0; varNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks[interfaceNdx].variables.size(); ++varNdx)
					collectStructPtrs(structTypes, m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks[interfaceNdx].variables[varNdx].varType);
		}

		for (std::set<const glu::StructType*>::iterator it = structTypes.begin(); it != structTypes.end(); ++it)
			delete *it;
	}

	for (int shaderNdx = 0; shaderNdx < (int)m_shaders.size(); ++shaderNdx)
		delete m_shaders[shaderNdx];
	m_shaders.clear();
}